

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::IsGroupOf_PDU::AddGED(IsGroupOf_PDU *this,GEDItem *GED)

{
  KUINT16 *pKVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  bVar2 = this->m_ui8GrpdEntCat;
  uVar3 = (*(GED->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[6])();
  if (uVar3 == bVar2) {
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
    ::push_back(&this->m_vpGED,GED);
    this->m_ui8NumOfGroupedEnts = this->m_ui8NumOfGroupedEnts + '\x01';
    iVar4 = (*(GED->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[7])();
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + ((ushort)iVar4 & 0xff);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddGED",&local_39);
  KException::KException(this_00,&local_38,8);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IsGroupOf_PDU::AddGED(const GEDItem &GED) noexcept(false)
{
    if( m_ui8GrpdEntCat != GED->GetGroupedEntityCategory() )throw KException( __FUNCTION__, INVALID_DATA );

    m_vpGED.push_back( GED );
    ++m_ui8NumOfGroupedEnts;
    m_ui16PDULength += GED->GetLength();
}